

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O1

void gf2MulTrinomial1(word *c,word *a,word *b,qr_o *f,void *stack)

{
  size_t n;
  
  n = f->n;
  ppMul((word *)stack,a,n,b,n,(void *)(n * 0x10 + (long)stack));
  gf2RedTrinomial1((word *)stack,f->n,(gf2_trinom_st *)f->params);
  wwCopy(c,(word *)stack,f->n);
  return;
}

Assistant:

static void gf2MulTrinomial1(word c[], const word a[], const word b[], 
	const qr_o* f, void* stack)
{
	word* prod = (word*)stack;
	stack = prod + 2 * f->n;
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	ASSERT(gf2IsIn(b, f));
	ppMul(prod, a, f->n, b, f->n, stack);
	gf2RedTrinomial1(prod, f->n, (const gf2_trinom_st*)f->params);
	wwCopy(c, prod, f->n);
}